

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,string *linkLibraries,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *tgt,bool relink,bool forResponseFile,bool useWatcomQuote)

{
  cmMakefile *pcVar1;
  int iVar2;
  char *pcVar3;
  cmComputeLinkInformation *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  cmOutputConverter *this_01;
  ItemVector *pIVar5;
  ostream *poVar6;
  OutputFormat output;
  pointer pbVar7;
  pointer pIVar8;
  string rpath_link;
  string standardLibsVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runtimeDirs;
  string linkFlagsVar;
  string linkLibs;
  string fwSearchFlagVar;
  string libPathTerminator;
  string linkLanguage;
  string libPathFlag;
  string config;
  ostringstream fout;
  
  output = RESPONSE;
  if (!forResponseFile) {
    output = useWatcomQuote | SHELL;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fout);
  pcVar1 = this->Makefile;
  std::__cxx11::string::string((string *)&linkLibs,"CMAKE_BUILD_TYPE",(allocator *)&linkLanguage);
  pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&linkLibs);
  std::__cxx11::string::string((string *)&config,pcVar3,(allocator *)&libPathFlag);
  std::__cxx11::string::~string((string *)&linkLibs);
  this_00 = cmTarget::GetLinkInformation(tgt->Target,&config);
  if (this_00 != (cmComputeLinkInformation *)0x0) {
    linkLibs._M_dataplus._M_p = (pointer)&linkLibs.field_2;
    linkLibs._M_string_length = 0;
    linkLibs.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&linkLanguage,(string *)&this_00->LinkLanguage);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&libPathTerminator,"CMAKE_LIBRARY_PATH_FLAG",(allocator *)&linkFlagsVar);
    pcVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&libPathTerminator);
    std::__cxx11::string::string((string *)&libPathFlag,pcVar3,(allocator *)&fwSearchFlagVar);
    std::__cxx11::string::~string((string *)&libPathTerminator);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&linkFlagsVar,"CMAKE_LIBRARY_PATH_TERMINATOR",(allocator *)&fwSearchFlagVar
              );
    pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&linkFlagsVar);
    std::__cxx11::string::string((string *)&libPathTerminator,pcVar3,(allocator *)&rpath_link);
    std::__cxx11::string::~string((string *)&linkFlagsVar);
    std::__cxx11::string::string
              ((string *)&linkFlagsVar,"CMAKE_SHARED_LIBRARY_LINK_",(allocator *)&fwSearchFlagVar);
    std::__cxx11::string::append((string *)&linkFlagsVar);
    std::__cxx11::string::append((char *)&linkFlagsVar);
    iVar2 = cmGeneratorTarget::GetType(tgt);
    if (iVar2 == 0) {
      cmMakefile::GetSafeDefinition(this->Makefile,&linkFlagsVar);
      std::__cxx11::string::assign((char *)&linkLibs);
      std::__cxx11::string::append((char *)&linkLibs);
    }
    std::__cxx11::string::string((string *)&fwSearchFlagVar,"CMAKE_",(allocator *)&rpath_link);
    std::__cxx11::string::append((string *)&fwSearchFlagVar);
    std::__cxx11::string::append((char *)&fwSearchFlagVar);
    pcVar3 = cmMakefile::GetDefinition(this->Makefile,&fwSearchFlagVar);
    if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
      pvVar4 = cmComputeLinkInformation::GetFrameworkPaths_abi_cxx11_(this_00);
      for (pbVar7 = (pvVar4->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar7 != (pvVar4->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
        std::__cxx11::string::append((char *)frameworkPath);
        cmOutputConverter::Convert(&rpath_link,&this->super_cmOutputConverter,pbVar7,NONE,output);
        std::__cxx11::string::append((string *)frameworkPath);
        std::__cxx11::string::~string((string *)&rpath_link);
        std::__cxx11::string::append((char *)frameworkPath);
      }
    }
    pvVar4 = cmComputeLinkInformation::GetDirectories_abi_cxx11_(this_00);
    this_01 = &this->super_cmOutputConverter;
    for (pbVar7 = (pvVar4->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar7 != (pvVar4->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
      cmOutputConverter::ConvertToOutputForExisting(&rpath_link,this_01,pbVar7,START_OUTPUT,output);
      std::operator+(&standardLibsVar," ",&libPathFlag);
      std::__cxx11::string::append((string *)linkPath);
      std::__cxx11::string::~string((string *)&standardLibsVar);
      std::__cxx11::string::append((string *)linkPath);
      std::__cxx11::string::append((string *)linkPath);
      std::__cxx11::string::append((char *)linkPath);
      std::__cxx11::string::~string((string *)&rpath_link);
    }
    pIVar5 = cmComputeLinkInformation::GetItems(this_00);
    for (pIVar8 = (pIVar5->
                  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pIVar8 != (pIVar5->
                  super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                  )._M_impl.super__Vector_impl_data._M_finish; pIVar8 = pIVar8 + 1) {
      if ((pIVar8->Target == (cmTarget *)0x0) ||
         (pIVar8->Target->TargetTypeValue != INTERFACE_LIBRARY)) {
        if (pIVar8->IsPath == true) {
          (*this->_vptr_cmLocalGenerator[0xe])(&rpath_link,this,pIVar8);
          std::__cxx11::string::append((string *)&linkLibs);
          std::__cxx11::string::~string((string *)&rpath_link);
        }
        else {
          std::__cxx11::string::append((string *)&linkLibs);
        }
        std::__cxx11::string::append((char *)&linkLibs);
      }
    }
    std::operator<<((ostream *)&fout,(string *)&linkLibs);
    if ((this_00->RuntimeSep)._M_string_length == 0) {
      runtimeDirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      runtimeDirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      runtimeDirs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      cmComputeLinkInformation::GetRPath(this_00,&runtimeDirs,relink);
      rpath_link._M_dataplus._M_p = (pointer)&rpath_link.field_2;
      rpath_link._M_string_length = 0;
      rpath_link.field_2._M_local_buf[0] = '\0';
      for (pbVar7 = runtimeDirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pbVar7 != runtimeDirs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
        std::__cxx11::string::append((string *)&rpath_link);
        cmOutputConverter::Convert(&standardLibsVar,this_01,pbVar7,NONE,output);
        std::__cxx11::string::append((string *)&rpath_link);
        std::__cxx11::string::~string((string *)&standardLibsVar);
        std::__cxx11::string::append((char *)&rpath_link);
      }
      std::operator<<((ostream *)&fout,(string *)&rpath_link);
      std::__cxx11::string::~string((string *)&rpath_link);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&runtimeDirs);
    }
    else {
      cmComputeLinkInformation::GetRPathString_abi_cxx11_(&rpath_link,this_00,relink);
      if (rpath_link._M_string_length != 0) {
        std::operator<<((ostream *)&fout,(string *)&this_00->RuntimeFlag);
        cmOutputConverter::EscapeForShell
                  (&standardLibsVar,this_01,&rpath_link,!forResponseFile,false,false);
        std::operator<<((ostream *)&fout,(string *)&standardLibsVar);
        std::__cxx11::string::~string((string *)&standardLibsVar);
        std::operator<<((ostream *)&fout," ");
      }
      std::__cxx11::string::~string((string *)&rpath_link);
    }
    cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_(&rpath_link,this_00);
    if (((this_00->RPathLinkFlag)._M_string_length != 0) && (rpath_link._M_string_length != 0)) {
      std::operator<<((ostream *)&fout,(string *)&this_00->RPathLinkFlag);
      cmOutputConverter::EscapeForShell
                (&standardLibsVar,this_01,&rpath_link,!forResponseFile,false,false);
      std::operator<<((ostream *)&fout,(string *)&standardLibsVar);
      std::__cxx11::string::~string((string *)&standardLibsVar);
      std::operator<<((ostream *)&fout," ");
    }
    std::__cxx11::string::string((string *)&standardLibsVar,"CMAKE_",(allocator *)&runtimeDirs);
    std::__cxx11::string::string((string *)&runtimeDirs,(string *)&this_00->LinkLanguage);
    std::__cxx11::string::append((string *)&standardLibsVar);
    std::__cxx11::string::~string((string *)&runtimeDirs);
    std::__cxx11::string::append((char *)&standardLibsVar);
    pcVar3 = cmMakefile::GetDefinition(this->Makefile,&standardLibsVar);
    if (pcVar3 != (char *)0x0) {
      poVar6 = std::operator<<((ostream *)&fout,pcVar3);
      std::operator<<(poVar6," ");
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)linkLibraries,(string *)&runtimeDirs);
    std::__cxx11::string::~string((string *)&runtimeDirs);
    std::__cxx11::string::~string((string *)&standardLibsVar);
    std::__cxx11::string::~string((string *)&rpath_link);
    std::__cxx11::string::~string((string *)&fwSearchFlagVar);
    std::__cxx11::string::~string((string *)&linkFlagsVar);
    std::__cxx11::string::~string((string *)&libPathTerminator);
    std::__cxx11::string::~string((string *)&libPathFlag);
    std::__cxx11::string::~string((string *)&linkLanguage);
    std::__cxx11::string::~string((string *)&linkLibs);
  }
  std::__cxx11::string::~string((string *)&config);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fout);
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(std::string& linkLibraries,
                                           std::string& frameworkPath,
                                           std::string& linkPath,
                                           cmGeneratorTarget &tgt,
                                           bool relink,
                                           bool forResponseFile,
                                           bool useWatcomQuote)
{
  OutputFormat shellFormat = (forResponseFile) ? RESPONSE :
                             ((useWatcomQuote) ? WATCOMQUOTE : SHELL);
  bool escapeAllowMakeVars = !forResponseFile;
  std::ostringstream fout;
  std::string config = this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmComputeLinkInformation* pcli = tgt.Target->GetLinkInformation(config);
  if(!pcli)
    {
    return;
    }
  cmComputeLinkInformation& cli = *pcli;

  // Collect library linking flags command line options.
  std::string linkLibs;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag =
    this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  std::string libPathTerminator =
    this->Makefile->GetSafeDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");

  // Flags to link an executable to shared libraries.
  std::string linkFlagsVar = "CMAKE_SHARED_LIBRARY_LINK_";
  linkFlagsVar += linkLanguage;
  linkFlagsVar += "_FLAGS";
  if( tgt.GetType() == cmTarget::EXECUTABLE )
    {
    linkLibs = this->Makefile->GetSafeDefinition(linkFlagsVar);
    linkLibs += " ";
    }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag =
    this->Makefile->GetDefinition(fwSearchFlagVar);
  if(fwSearchFlag && *fwSearchFlag)
    {
    std::vector<std::string> const& fwDirs = cli.GetFrameworkPaths();
    for(std::vector<std::string>::const_iterator fdi = fwDirs.begin();
        fdi != fwDirs.end(); ++fdi)
      {
      frameworkPath += fwSearchFlag;
      frameworkPath += this->Convert(*fdi, NONE, shellFormat);
      frameworkPath += " ";
      }
    }

  // Append the library search path flags.
  std::vector<std::string> const& libDirs = cli.GetDirectories();
  for(std::vector<std::string>::const_iterator libDir = libDirs.begin();
      libDir != libDirs.end(); ++libDir)
    {
    std::string libpath = this->ConvertToOutputForExisting(*libDir,
                                                           START_OUTPUT,
                                                           shellFormat);
    linkPath += " " + libPathFlag;
    linkPath += libpath;
    linkPath += libPathTerminator;
    linkPath += " ";
    }

  // Append the link items.
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  for(ItemVector::const_iterator li = items.begin(); li != items.end(); ++li)
    {
    if(li->Target && li->Target->GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    if(li->IsPath)
      {
      linkLibs += this->ConvertToLinkReference(li->Value, shellFormat);
      }
    else
      {
      linkLibs += li->Value;
      }
    linkLibs += " ";
    }

  // Write the library flags to the build rule.
  fout << linkLibs;

  // Check what kind of rpath flags to use.
  if(cli.GetRuntimeSep().empty())
    {
    // Each rpath entry gets its own option ("-R a -R b -R c")
    std::vector<std::string> runtimeDirs;
    cli.GetRPath(runtimeDirs, relink);

    std::string rpath;
    for(std::vector<std::string>::iterator ri = runtimeDirs.begin();
        ri != runtimeDirs.end(); ++ri)
      {
      rpath += cli.GetRuntimeFlag();
      rpath += this->Convert(*ri, NONE, shellFormat);
      rpath += " ";
      }
    fout << rpath;
    }
  else
    {
    // All rpath entries are combined ("-Wl,-rpath,a:b:c").
    std::string rpath = cli.GetRPathString(relink);

    // Store the rpath option in the stream.
    if(!rpath.empty())
      {
      fout << cli.GetRuntimeFlag();
      fout << this->EscapeForShell(rpath, escapeAllowMakeVars);
      fout << " ";
      }
    }

  // Add the linker runtime search path if any.
  std::string rpath_link = cli.GetRPathLinkString();
  if(!cli.GetRPathLinkFlag().empty() && !rpath_link.empty())
    {
    fout << cli.GetRPathLinkFlag();
    fout << this->EscapeForShell(rpath_link, escapeAllowMakeVars);
    fout << " ";
    }

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  if(const char* stdLibs =
     this->Makefile->GetDefinition(standardLibsVar))
    {
    fout << stdLibs << " ";
    }

  linkLibraries = fout.str();
}